

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CalcWindowContentSizes
               (ImGuiWindow *window,ImVec2 *content_size_current,ImVec2 *content_size_ideal)

{
  bool bVar1;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  float fVar2;
  bool preserve_old_content_sizes;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  
  bVar1 = false;
  if ((((*(byte *)(in_RDI + 0x91) & 1) == 0) || ('\0' < *(char *)(in_RDI + 0xa8))) ||
     ('\0' < *(char *)(in_RDI + 0xa9))) {
    if ((((*(byte *)(in_RDI + 0x95) & 1) != 0) && (*(char *)(in_RDI + 0xb1) == '\0')) &&
       ('\0' < *(char *)(in_RDI + 0xb0))) {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    *(undefined8 *)in_RSI = *(undefined8 *)(in_RDI + 0x28);
    *(undefined8 *)in_RDX = *(undefined8 *)(in_RDI + 0x30);
  }
  else {
    if ((*(float *)(in_RDI + 0x38) != 0.0) || (NAN(*(float *)(in_RDI + 0x38)))) {
      local_20 = *(float *)(in_RDI + 0x38);
    }
    else {
      local_20 = (float)(int)(*(float *)(in_RDI + 0xf0) - *(float *)(in_RDI + 0xe8));
    }
    *in_RSI = local_20;
    if ((*(float *)(in_RDI + 0x3c) != 0.0) || (NAN(*(float *)(in_RDI + 0x3c)))) {
      local_24 = *(float *)(in_RDI + 0x3c);
    }
    else {
      local_24 = (float)(int)(*(float *)(in_RDI + 0xf4) - *(float *)(in_RDI + 0xec));
    }
    in_RSI[1] = local_24;
    if ((*(float *)(in_RDI + 0x38) != 0.0) || (NAN(*(float *)(in_RDI + 0x38)))) {
      local_28 = *(float *)(in_RDI + 0x38);
    }
    else {
      fVar2 = ImMax<float>(*(float *)(in_RDI + 0xf0),*(float *)(in_RDI + 0xf8));
      local_28 = (float)(int)(fVar2 - *(float *)(in_RDI + 0xe8));
    }
    *in_RDX = local_28;
    if ((*(float *)(in_RDI + 0x3c) != 0.0) || (NAN(*(float *)(in_RDI + 0x3c)))) {
      local_2c = *(float *)(in_RDI + 0x3c);
    }
    else {
      fVar2 = ImMax<float>(*(float *)(in_RDI + 0xf4),*(float *)(in_RDI + 0xfc));
      local_2c = (float)(int)(fVar2 - *(float *)(in_RDI + 0xec));
    }
    in_RDX[1] = local_2c;
  }
  return;
}

Assistant:

static void CalcWindowContentSizes(ImGuiWindow* window, ImVec2* content_size_current, ImVec2* content_size_ideal)
{
    bool preserve_old_content_sizes = false;
    if (window->Collapsed && window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
        preserve_old_content_sizes = true;
    else if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        preserve_old_content_sizes = true;
    if (preserve_old_content_sizes)
    {
        *content_size_current = window->ContentSize;
        *content_size_ideal = window->ContentSizeIdeal;
        return;
    }

    content_size_current->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    content_size_current->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    content_size_ideal->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(ImMax(window->DC.CursorMaxPos.x, window->DC.IdealMaxPos.x) - window->DC.CursorStartPos.x);
    content_size_ideal->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(ImMax(window->DC.CursorMaxPos.y, window->DC.IdealMaxPos.y) - window->DC.CursorStartPos.y);
}